

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

void __thiscall EventDispatcherHelper::dispatchEvent(EventDispatcherHelper *this,Event *ev)

{
  EventAgent *agent;
  AutoLock _auto_lock_;
  AutoLock AStack_28;
  
  AutoLock::AutoLock(&AStack_28,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x3b);
  if (ev == (Event *)0x0) {
    jh_log_print(2,"void EventDispatcherHelper::dispatchEvent(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0x3f,"Attempt to dispatch NULL event");
  }
  else if (*(int *)&(ev->super_RefCount).field_0xc == -5) {
    (*(ev->super_RefCount)._vptr_RefCount[3])(ev);
  }
  else {
    lookupListeners(this,ev);
  }
  AutoLock::~AutoLock(&AStack_28);
  return;
}

Assistant:

void EventDispatcherHelper::dispatchEvent( Event *ev )
{	
	DebugAutoLock( mLock );
	
	if ( ev == NULL )
	{
		LOG_WARN( "Attempt to dispatch NULL event" );
		return;
	}
	
	if ( ev->getEventId() == Event::kAgentEventId )
	{
		EventAgent *agent = event_cast<EventAgent>( ev );
		if ( agent != NULL )
			agent->deliver();
	}
	else
	{
		lookupListeners( ev );
	}
}